

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O2

int Tim_ManBoxOutputLast(Tim_Man_t *p,int iBox)

{
  int iVar1;
  int iVar2;
  Tim_Box_t *pTVar3;
  Tim_Box_t *pTVar4;
  
  pTVar3 = Tim_ManBox(p,iBox);
  pTVar4 = Tim_ManBox(p,iBox);
  iVar1 = (&pTVar3[1].iBox)[pTVar4->nInputs];
  iVar2 = Tim_ManBoxOutputNum(p,iBox);
  return iVar2 + iVar1 + -1;
}

Assistant:

int Tim_ManBoxOutputLast( Tim_Man_t * p, int iBox )
{
    return Tim_ManBox(p, iBox)->Inouts[Tim_ManBox(p, iBox)->nInputs] + Tim_ManBoxOutputNum(p, iBox) - 1;
}